

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O0

int __thiscall File::rename(File *this,char *__old,char *__new)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  int *piVar5;
  int err;
  int fd;
  bool failIfExists_local;
  String *to_local;
  String *from_local;
  
  if (((ulong)__new & 1) == 0) {
    pcVar3 = String::operator_cast_to_char_((String *)this);
    pcVar4 = String::operator_cast_to_char_((String *)__old);
    iVar2 = ::rename(pcVar3,pcVar4);
    from_local._7_1_ = iVar2 == 0;
    piVar5 = (int *)(ulong)CONCAT31((int3)((uint)iVar2 >> 8),from_local._7_1_);
  }
  else {
    pcVar3 = String::operator_cast_to_char_((String *)__old);
    uVar1 = ::open(pcVar3,0x800c0,0x1a4);
    piVar5 = (int *)(ulong)uVar1;
    if (uVar1 == 0xffffffff) {
      from_local._7_1_ = false;
    }
    else {
      pcVar3 = String::operator_cast_to_char_((String *)this);
      pcVar4 = String::operator_cast_to_char_((String *)__old);
      iVar2 = ::rename(pcVar3,pcVar4);
      if (iVar2 == 0) {
        uVar1 = ::close(uVar1);
        piVar5 = (int *)(ulong)uVar1;
        from_local._7_1_ = true;
      }
      else {
        piVar5 = __errno_location();
        iVar2 = *piVar5;
        ::close(uVar1);
        piVar5 = __errno_location();
        *piVar5 = iVar2;
        from_local._7_1_ = false;
      }
    }
  }
  return (int)CONCAT71((int7)((ulong)piVar5 >> 8),from_local._7_1_);
}

Assistant:

bool File::rename(const String& from, const String& to, bool failIfExists)
{
#ifdef _WIN32
  return MoveFileEx(from, to, MOVEFILE_COPY_ALLOWED | (failIfExists ? 0 : MOVEFILE_REPLACE_EXISTING)) == TRUE;
#else
  if(failIfExists)
  {
    int fd = ::open(to, O_CREAT | O_EXCL | O_CLOEXEC, S_IRUSR | S_IWUSR | S_IRGRP | S_IROTH);
    if(fd == -1)
      return false;
    if(::rename(from, to) != 0)
    {
      int err = errno;
      ::close(fd);
      errno = err;
      return false;
    }
    ::close(fd);
    return true;
  }
  else
    return ::rename(from, to) == 0;
#endif
}